

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_double_suite::test_linear_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  double absolute_tolerance;
  double *in_stack_fffffffffffffbe8;
  double local_400;
  value_type local_3f8;
  value_type local_3f0;
  double local_3e0;
  value_type local_3d8;
  value_type local_3d0;
  double local_3c0;
  value_type local_3b8;
  value_type local_3b0;
  double local_3a0;
  value_type local_398;
  value_type local_390;
  double local_380;
  value_type local_378;
  value_type local_370;
  double local_360;
  value_type local_358;
  value_type local_350;
  double local_340;
  value_type local_338;
  value_type local_330;
  double local_320;
  value_type local_318;
  value_type local_310;
  double local_300;
  value_type local_2f8;
  value_type local_2f0;
  double local_2e0;
  value_type local_2d8;
  value_type local_2d0;
  double local_2c0;
  value_type local_2b8;
  value_type local_2b0;
  double local_2a0;
  value_type local_298;
  value_type local_290;
  double local_280;
  value_type local_278;
  value_type local_270;
  double local_260;
  value_type local_258;
  value_type local_250;
  double local_240;
  value_type local_238;
  value_type local_230;
  double local_220;
  value_type local_218;
  value_type local_210;
  double local_200;
  value_type local_1f8;
  value_type local_1f0;
  double local_1e0;
  value_type local_1d8;
  value_type local_1d0;
  double local_1c0;
  value_type local_1b8;
  value_type local_1b0;
  double local_1a0;
  value_type local_198;
  value_type local_190;
  double local_180;
  value_type local_178;
  value_type local_170;
  double local_160;
  value_type local_158;
  value_type local_150;
  double local_140;
  value_type local_138;
  value_type local_130;
  double local_120;
  value_type local_118;
  value_type local_110;
  double local_100;
  value_type local_f8;
  value_type local_f0;
  double local_e0;
  value_type local_d8;
  value_type local_d0;
  double local_c0;
  value_type local_b8;
  value_type local_b0;
  double local_a0;
  value_type local_98 [4];
  undefined8 local_78;
  value_type local_70 [2];
  undefined1 local_60 [8];
  moment_skewness<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_(trial::online::with)3> *)local_60,0.125,0.25,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,1.0);
  local_70[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x208,"void skewness_double_suite::test_linear_increase()",local_70,&local_78);
  local_98[2] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_98[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x209,"void skewness_double_suite::test_linear_increase()",local_98 + 2,local_98 + 1);
  local_98[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_a0 = 0.0;
  local_b0 = filter.sum.skewness;
  predicate_26.absolute = tolerance.relative;
  predicate_26.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20a,0x111b31,(char *)local_98,&local_a0,in_stack_fffffffffffffbe8,
             predicate_26);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,2.0);
  local_b8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_c0 = 1.53333;
  local_d0 = filter.sum.skewness;
  predicate_25.absolute = tolerance.relative;
  predicate_25.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20c,0x111b31,(char *)&local_b8,&local_c0,in_stack_fffffffffffffbe8,
             predicate_25);
  local_d8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_e0 = 0.124444;
  local_f0 = filter.sum.skewness;
  predicate_24.absolute = tolerance.relative;
  predicate_24.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20d,0x111b31,(char *)&local_d8,&local_e0,in_stack_fffffffffffffbe8,
             predicate_24);
  local_f8 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                       ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_100 = 1.32288;
  local_110 = filter.sum.skewness;
  predicate_23.absolute = tolerance.relative;
  predicate_23.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20e,0x111b31,(char *)&local_f8,&local_100,in_stack_fffffffffffffbe8,
             predicate_23);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,3.0);
  local_118 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_120 = 2.08876;
  local_130 = filter.sum.skewness;
  predicate_22.absolute = tolerance.relative;
  predicate_22.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08876","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x210,0x111b31,(char *)&local_118,&local_120,in_stack_fffffffffffffbe8,
             predicate_22);
  local_138 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_140 = 0.429707;
  local_150 = filter.sum.skewness;
  predicate_21.absolute = tolerance.relative;
  predicate_21.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.429707","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x211,0x111b31,(char *)&local_138,&local_140,in_stack_fffffffffffffbe8,
             predicate_21);
  local_158 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_160 = 1.27863;
  local_170 = filter.sum.skewness;
  predicate_20.absolute = tolerance.relative;
  predicate_20.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.27863","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x212,0x111b31,(char *)&local_158,&local_160,in_stack_fffffffffffffbe8,
             predicate_20);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,4.0);
  local_178 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_180 = 2.66608;
  local_190 = filter.sum.skewness;
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66608","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x214,0x111b31,(char *)&local_178,&local_180,in_stack_fffffffffffffbe8,
             predicate_19);
  local_198 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_1a0 = 0.923291;
  local_1b0 = filter.sum.skewness;
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.923291","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x215,0x111b31,(char *)&local_198,&local_1a0,in_stack_fffffffffffffbe8,
             predicate_18);
  local_1b8 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_1c0 = 1.23592;
  local_1d0 = filter.sum.skewness;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.23592","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x216,0x111b31,(char *)&local_1b8,&local_1c0,in_stack_fffffffffffffbe8,
             predicate_17);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,5.0);
  local_1d8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_1e0 = 3.26502;
  local_1f0 = filter.sum.skewness;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.26502","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x218,0x111b31,(char *)&local_1d8,&local_1e0,in_stack_fffffffffffffbe8,
             predicate_16);
  local_1f8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_200 = 1.60733;
  local_210 = filter.sum.skewness;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.60733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x219,0x111b31,(char *)&local_1f8,&local_200,in_stack_fffffffffffffbe8,
             predicate_15);
  local_218 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_220 = 1.20177;
  local_230 = filter.sum.skewness;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.20177","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21a,0x111b31,(char *)&local_218,&local_220,in_stack_fffffffffffffbe8,
             predicate_14);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,6.0);
  local_238 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_240 = 3.88525;
  local_250 = filter.sum.skewness;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.88525","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21c,0x111b31,(char *)&local_238,&local_240,in_stack_fffffffffffffbe8,
             predicate_13);
  local_258 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_260 = 2.47861;
  local_270 = filter.sum.skewness;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.47861","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21d,0x111b31,(char *)&local_258,&local_260,in_stack_fffffffffffffbe8,
             predicate_12);
  local_278 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_280 = 1.1738;
  local_290 = filter.sum.skewness;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1738","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21e,0x111b31,(char *)&local_278,&local_280,in_stack_fffffffffffffbe8,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,7.0);
  local_298 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_2a0 = 4.52635;
  local_2b0 = filter.sum.skewness;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.52635","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x220,0x111b31,(char *)&local_298,&local_2a0,in_stack_fffffffffffffbe8,
             predicate_10);
  local_2b8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_2c0 = 3.52889;
  local_2d0 = filter.sum.skewness;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.52889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x221,0x111b31,(char *)&local_2b8,&local_2c0,in_stack_fffffffffffffbe8,
             predicate_09);
  local_2d8 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_2e0 = 1.15036;
  local_2f0 = filter.sum.skewness;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.15036","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x222,0x111b31,(char *)&local_2d8,&local_2e0,in_stack_fffffffffffffbe8,
             predicate_08);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,8.0);
  local_2f8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_300 = 5.18786;
  local_310 = filter.sum.skewness;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.18786","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x224,0x111b31,(char *)&local_2f8,&local_300,in_stack_fffffffffffffbe8,
             predicate_07);
  local_318 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_320 = 4.7455;
  local_330 = filter.sum.skewness;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","4.7455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x225,0x111b31,(char *)&local_318,&local_320,in_stack_fffffffffffffbe8,
             predicate_06);
  local_338 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_340 = 1.13038;
  local_350 = filter.sum.skewness;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.13038","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x226,0x111b31,(char *)&local_338,&local_340,in_stack_fffffffffffffbe8,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,9.0);
  local_358 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_360 = 5.86924;
  local_370 = filter.sum.skewness;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.86924","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x228,0x111b31,(char *)&local_358,&local_360,in_stack_fffffffffffffbe8,
             predicate_04);
  local_378 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_380 = 6.11216;
  local_390 = filter.sum.skewness;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","6.11216","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x229,0x111b31,(char *)&local_378,&local_380,in_stack_fffffffffffffbe8,
             predicate_03);
  local_398 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_3a0 = 1.1132;
  local_3b0 = filter.sum.skewness;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1132","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22a,0x111b31,(char *)&local_398,&local_3a0,in_stack_fffffffffffffbe8,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,10.0);
  local_3b8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_3c0 = 6.56991;
  local_3d0 = filter.sum.skewness;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.56991","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22c,0x111b31,(char *)&local_3b8,&local_3c0,in_stack_fffffffffffffbe8,
             predicate_01);
  local_3d8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_3e0 = 7.60984;
  local_3f0 = filter.sum.skewness;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","7.60984","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22d,0x111b31,(char *)&local_3d8,&local_3e0,in_stack_fffffffffffffbe8,
             predicate_00);
  local_3f8 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_400 = 1.09832;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.09832","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22e,0x111b31,(char *)&local_3f8,&local_400,in_stack_fffffffffffffbe8,
             predicate);
  return;
}

Assistant:

void test_linear_increase()
{
    // Results are inherently skewed because of the weights of exponential smoothing

    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_skewness<double> filter(one_over_eight, one_over_four, one_over_four);

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 2.08876, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.429707, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.27863, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66608, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.923291, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.23592, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 3.26502, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.60733, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.20177, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 3.88525, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.47861, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1738, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 4.52635, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 3.52889, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.15036, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 5.18786, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 4.7455, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.13038, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 5.86924, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 6.11216, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1132, tolerance);
    filter.push(10.0);
    TRIAL_TEST_WITH(filter.mean(), 6.56991, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 7.60984, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.09832, tolerance);
}